

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

bool __thiscall
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(ThreadContext *this,DynamicObject *object)

{
  int iVar1;
  Type TVar2;
  Type pSVar3;
  Type pIVar4;
  code *pcVar5;
  bool bVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Type *ppIVar9;
  Type *pTVar10;
  DynamicObject *this_00;
  int iVar11;
  Type TVar12;
  Iterator local_50;
  ThreadContext *local_40;
  ulong local_38;
  
  TVar12 = (this->storeFieldInlineCacheByPropId).bucketCount;
  if (TVar12 != 0) {
    local_40 = this;
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_38 = 0;
    do {
      iVar11 = (local_40->storeFieldInlineCacheByPropId).buckets[local_38];
      if (iVar11 != -1) {
        do {
          pSVar3 = (local_40->storeFieldInlineCacheByPropId).entries;
          iVar1 = pSVar3[iVar11].
                  super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .
                  super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                  .
                  super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                  .next;
          local_50.list =
               &(pSVar3[iVar11].
                 super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .
                 super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                 .
                 super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                 .
                 super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .value)->super_SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>;
          local_50.current = &(local_50.list)->super_SListNodeBase<Memory::ArenaAllocator>;
LAB_007b4a13:
          if ((SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current ==
              (SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) {
LAB_007b4bce:
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar8 = 0;
          }
          local_50.current =
               (((SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current)->
               super_SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
          if ((SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount> *)local_50.current !=
              local_50.list) {
            ppIVar9 = SListBase<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>::Iterator::
                      Data(&local_50);
            pIVar4 = *ppIVar9;
            if ((pIVar4 != (Type)0x0) && (pTVar10 = (pIVar4->u).local.type, pTVar10 != (Type *)0x0))
            {
              if ((undefined1  [24])((undefined1  [24])pIVar4->u & (undefined1  [24])0x1) ==
                  (undefined1  [24])0x0) {
                if (((ulong)pTVar10 & 1) == 0) {
                  if ((undefined1  [24])((undefined1  [24])pIVar4->u & (undefined1  [24])0x1) ==
                      (undefined1  [24])0x0) {
                    pTVar10 = (Type *)0x0;
                  }
                  else {
                    pTVar10 = (Type *)(pIVar4->u).proto.prototypeObject;
                  }
                }
                else {
                  pTVar10 = (pIVar4->u).local.typeWithoutProperty;
                }
              }
              this_00 = *(DynamicObject **)(((ulong)pTVar10 & 0xfffffffffffffffb) + 0x10);
              while( true ) {
                if (this_00 == (DynamicObject *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                  if (!bVar6) goto LAB_007b4bce;
                  *puVar8 = 0;
                }
                TVar2 = ((this_00->super_RecyclableObject).type.ptr)->typeId;
                if ((0x57 < (int)TVar2) &&
                   (BVar7 = Js::RecyclableObject::IsExternal(&this_00->super_RecyclableObject),
                   BVar7 == 0)) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar8 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                     ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                     "GetTypeId aValue has invalid TypeId");
                  if (!bVar6) goto LAB_007b4bce;
                  *puVar8 = 0;
                }
                if ((TVar2 == TypeIds_Null) || (TVar2 == TypeIds_Proxy)) goto LAB_007b4a13;
                if (this_00 == object) break;
                this_00 = (DynamicObject *)
                          Js::RecyclableObject::GetPrototype(&this_00->super_RecyclableObject);
              }
              if (TVar2 != TypeIds_Proxy) {
                return true;
              }
            }
            goto LAB_007b4a13;
          }
          iVar11 = iVar1;
        } while (iVar1 != -1);
        TVar12 = (local_40->storeFieldInlineCacheByPropId).bucketCount;
      }
      local_38 = local_38 + 1;
    } while (local_38 < TVar12);
  }
  return false;
}

Assistant:

bool
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(Js::DynamicObject * object)
{
    return storeFieldInlineCacheByPropId.MapUntil([object](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        FOREACH_SLISTBASE_ENTRY(Js::InlineCache*, inlineCache, inlineCacheList)
        {
            if (inlineCache != nullptr && !inlineCache->IsEmpty())
            {
                // Verify this object is not present in prototype chain of inlineCache's type
                bool isObjectPresentOnPrototypeChain =
                    Js::JavascriptOperators::MapObjectAndPrototypesUntil<true>(inlineCache->GetType()->GetPrototype(), [=](Js::RecyclableObject* prototype)
                {
                    return prototype == object;
                });
                if (isObjectPresentOnPrototypeChain) {
                    return true;
                }
            }
        }
        NEXT_SLISTBASE_ENTRY;
        return false;
    });
}